

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
 __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::handle_value<nlohmann::detail::value_t>
          (json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,value_t *v,bool skip_callback)

{
  value_t vVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  pointer ppbVar4;
  json_value jVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar9;
  pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
  pVar10;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value;
  parse_event_t local_69;
  undefined1 local_68 [8];
  json_value local_60;
  int local_54;
  undefined1 local_50 [8];
  json_value local_48;
  undefined1 local_40 [8];
  json_value local_38;
  
  p_Var3 = (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar2 = (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar2 == 0 &&
      (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p == p_Var3) {
    __assert_fail("not keep_stack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                  ,0x12fa,
                  "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = nlohmann::detail::value_t]"
                 );
  }
  uVar8 = (ulong)uVar2 - 1;
  uVar7 = (ulong)uVar2 + 0x3e;
  if (-1 < (long)uVar8) {
    uVar7 = uVar8;
  }
  if ((p_Var3[((long)uVar7 >> 6) + ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)]
       >> (uVar8 & 0x3f) & 1) == 0) {
    uVar8 = 0;
    pbVar9 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
    goto LAB_002251a6;
  }
  local_68[0] = *v;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::json_value((json_value *)(local_68 + 8),local_68[0]);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  if (skip_callback) {
LAB_00224f7f:
    ppbVar4 = (this->ref_stack).
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->ref_stack).
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ._M_impl.super__Vector_impl_data._M_start == ppbVar4) {
      local_40[0] = local_68[0];
      local_38 = local_60;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_68);
      local_68[0] = null;
      local_60.object = (object_t *)0x0;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_40);
      pbVar9 = this->root;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_40);
      vVar1 = pbVar9->m_type;
      pbVar9->m_type = local_40[0];
      jVar5 = pbVar9->m_value;
      pbVar9->m_value = local_38;
      local_40[0] = vVar1;
      local_38 = jVar5;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(pbVar9);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_40);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_40 + 8),local_40[0]);
      pbVar9 = this->root;
    }
    else {
      pbVar9 = ppbVar4[-1];
      if (pbVar9 == (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)0x0) goto LAB_00225186;
      if (pbVar9->m_type == object) {
        p_Var3 = (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        uVar2 = (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        if (uVar2 == 0 &&
            (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p == p_Var3) {
          __assert_fail("not key_keep_stack.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                        ,0x1329,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = nlohmann::detail::value_t]"
                       );
        }
        uVar8 = (ulong)uVar2 - 1;
        uVar7 = (ulong)uVar2 + 0x3e;
        if (-1 < (long)uVar8) {
          uVar7 = uVar8;
        }
        uVar7 = p_Var3[((long)uVar7 >> 6) +
                       ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)];
        (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = uVar2 - 1;
        if (uVar2 == 0) {
          (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
          (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var3 + -1;
        }
        if ((1L << ((byte)uVar8 & 0x3f) & uVar7) == 0) goto LAB_00225186;
        if (this->object_element ==
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)0x0) {
          __assert_fail("object_element",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                        ,0x1332,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = nlohmann::detail::value_t]"
                       );
        }
        local_50[0] = local_68[0];
        local_48 = local_60;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_68);
        local_68[0] = null;
        local_60.object = (object_t *)0x0;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_50);
        pbVar9 = this->object_element;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_50);
        vVar1 = pbVar9->m_type;
        pbVar9->m_type = local_50[0];
        jVar5 = pbVar9->m_value;
        pbVar9->m_value = local_48;
        local_50[0] = vVar1;
        local_48 = jVar5;
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar9);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_50);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_50 + 8),local_50[0]);
        pbVar9 = this->object_element;
      }
      else {
        if (pbVar9->m_type != array) {
          __assert_fail("ref_stack.back()->is_array() or ref_stack.back()->is_object()",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                        ,0x131d,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = nlohmann::detail::value_t]"
                       );
        }
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)(pbVar9->m_value).object,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_68);
        pbVar9 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)((((this->ref_stack).
                       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]->m_value).string)->
                     _M_string_length - 0x10);
      }
    }
    uVar8 = CONCAT71((int7)((ulong)this >> 8),1);
  }
  else {
    local_54 = (int)((ulong)((long)(this->ref_stack).
                                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->ref_stack).
                                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_69 = value;
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar6 = (*(this->callback)._M_invoker)
                      ((_Any_data *)&this->callback,&local_54,&local_69,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_68);
    if (bVar6) goto LAB_00224f7f;
LAB_00225186:
    uVar8 = 0;
    pbVar9 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_68 + 8),local_68[0]);
LAB_002251a6:
  pVar10._0_8_ = uVar8 & 0xffffffff;
  pVar10.second = pbVar9;
  return pVar10;
}

Assistant:

std::pair<bool, BasicJsonType*> handle_value(Value&& v, const bool skip_callback = false)
    {
        assert(not keep_stack.empty());

        // do not handle this value if we know it would be added to a discarded
        // container
        if (not keep_stack.back())
        {
            return {false, nullptr};
        }

        // create value
        auto value = BasicJsonType(std::forward<Value>(v));

        // check callback
        const bool keep = skip_callback or callback(static_cast<int>(ref_stack.size()), parse_event_t::value, value);

        // do not handle this value if we just learnt it shall be discarded
        if (not keep)
        {
            return {false, nullptr};
        }

        if (ref_stack.empty())
        {
            root = std::move(value);
            return {true, &root};
        }

        // skip this value if we already decided to skip the parent
        // (https://github.com/nlohmann/json/issues/971#issuecomment-413678360)
        if (not ref_stack.back())
        {
            return {false, nullptr};
        }

        // we now only expect arrays and objects
        assert(ref_stack.back()->is_array() or ref_stack.back()->is_object());

        // array
        if (ref_stack.back()->is_array())
        {
            ref_stack.back()->m_value.array->push_back(std::move(value));
            return {true, &(ref_stack.back()->m_value.array->back())};
        }

        // object
        assert(ref_stack.back()->is_object());
        // check if we should store an element for the current key
        assert(not key_keep_stack.empty());
        const bool store_element = key_keep_stack.back();
        key_keep_stack.pop_back();

        if (not store_element)
        {
            return {false, nullptr};
        }

        assert(object_element);
        *object_element = std::move(value);
        return {true, object_element};
    }